

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line-parser.cpp
# Opt level: O2

void license::printHelpHeader(char *prog_name)

{
  ostream *poVar1;
  string local_50 [32];
  path local_30;
  
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  boost::filesystem::path::path(&local_30,prog_name);
  boost::filesystem::path::filename();
  poVar1 = std::operator<<((ostream *)&std::cout,local_50);
  poVar1 = std::operator<<(poVar1," Version ");
  poVar1 = std::operator<<(poVar1,"");
  poVar1 = std::operator<<(poVar1,". Usage:");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

static void printHelpHeader(const char *prog_name) {
	cout << endl;
	cout << fs::path(prog_name).filename().string() << " Version " << PROJECT_VERSION << ". Usage:" << endl;
}